

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppgenerator.cpp
# Opt level: O2

void __thiscall CppGenerator::operator()(CppGenerator *this)

{
  _Rb_tree_node_base *n;
  QList<int> *this_00;
  QList<int> *this_01;
  size_t sVar1;
  long lVar2;
  Recognizer *pRVar3;
  FILE *pFVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int *table;
  int *table_00;
  iterator iVar10;
  iterator iVar11;
  int *piVar12;
  TokenInfo TVar13;
  TokenInfo TVar14;
  QTextStream *pQVar15;
  _Base_ptr p_Var16;
  Automaton *pAVar17;
  _List_iterator<Rule> _Var18;
  pointer piVar19;
  pointer piVar20;
  byte bVar21;
  int iVar22;
  Data *pDVar23;
  Grammar *pGVar24;
  undefined8 *puVar25;
  int iVar26;
  StatePointer state;
  CppGenerator *pCVar27;
  size_t sVar28;
  long lVar29;
  int iVar30;
  int j_2;
  _List_node_base *p_Var31;
  long lVar32;
  int j;
  ulong uVar33;
  long in_FS_OFFSET;
  int local_15c;
  undefined8 local_138;
  undefined8 uStack_130;
  QArrayDataPointer<char16_t> local_120;
  Recognizer *local_108;
  Grammar *pGStack_100;
  QArrayDataPointer<char16_t> local_f8;
  undefined1 local_d8 [32];
  QArrayDataPointer<char16_t> local_b8;
  undefined1 local_98 [8];
  Data *pDStack_90;
  _Base_ptr local_88;
  _Base_ptr local_80;
  _Base_ptr local_78;
  int *local_70;
  NameSet lookaheads;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pAVar17 = this->aut;
  state._M_node = (_List_node_base *)&pAVar17->states;
  iVar26 = (int)(pAVar17->states).super__List_base<State,_std::allocator<State>_>._M_impl._M_node.
                _M_size;
  this->state_count = iVar26;
  iVar22 = (int)(this->grammar->terminals)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  this->terminal_count = iVar22;
  iVar30 = (int)(this->grammar->non_terminals)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  this->non_terminal_count = iVar30;
  iVar22 = iVar22 * iVar26;
  sVar1 = (long)iVar22 * 4;
  sVar28 = sVar1;
  if (iVar22 < 0) {
    sVar28 = 0xffffffffffffffff;
  }
  table = (int *)operator_new__(sVar28);
  local_15c = 0;
  memset(table,0,sVar1);
  iVar30 = iVar30 * iVar26;
  sVar1 = (long)iVar30 * 4;
  uVar33 = 0xffffffffffffffff;
  if (-1 < iVar30) {
    uVar33 = sVar1;
  }
  table_00 = (int *)operator_new__(uVar33);
  memset(table_00,0,sVar1);
  this->accept_state = -1;
  iVar26 = 0;
  while (state._M_node = (state._M_node)->_M_next,
        state._M_node != (_List_node_base *)&pAVar17->states) {
    iVar22 = Automaton::id(pAVar17,state);
    for (iVar10._M_node =
              (_Base_ptr)
              QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::begin
                        ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)
                         (state._M_node + 4));
        iVar11 = QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::end
                           ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)
                            (state._M_node + 4)), (iterator)iVar10._M_node != iVar11.i._M_node;
        iVar10._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar10._M_node)) {
      iVar30 = Automaton::id(this->aut,*(_List_node_base **)(iVar10._M_node + 1));
      iVar7 = Automaton::id(this->aut,(_List_node_base *)iVar10._M_node[1]._M_parent);
      bVar5 = Grammar::isNonTerminal(this->grammar,*(_List_node_base **)(iVar10._M_node + 1));
      if (bVar5) {
        iVar30 = (iVar30 - this->terminal_count) + this->non_terminal_count * iVar22;
        piVar12 = table_00;
      }
      else {
        iVar30 = iVar30 + this->terminal_count * iVar22;
        piVar12 = table;
      }
      piVar12[iVar30] = iVar7;
    }
    local_b8.d = (Data *)&state._M_node[2]._M_prev;
    while (local_b8.d = (Data *)((_List_node_base *)local_b8.d)->_M_next,
          local_b8.d != (Data *)&state._M_node[2]._M_prev) {
      if (((_List_node_base *)local_b8.d)[1]._M_prev ==
          (_List_node_base *)&((_List_node_base *)local_b8.d)[1]._M_next[1]._M_prev) {
        iVar30 = Automaton::id(this->aut,((_List_node_base *)local_b8.d)[1]._M_next);
        lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)0xaaaaaaaaaaaaaaaa;
        lookaheads._M_t._M_impl.super__Rb_tree_header._M_node_count = 0xaaaaaaaaaaaaaaaa;
        lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0xaaaaaaaaaaaaaaaa;
        lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)0xaaaaaaaaaaaaaaaa;
        lookaheads._M_t._M_impl._0_8_ = 0xaaaaaaaaaaaaaaaa;
        lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xaaaaaaaa;
        lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0xaaaaaaaa;
        local_98._0_4_ = NonAssoc;
        local_98._4_4_ = 0;
        pDStack_90 = (Data *)0x0;
        local_88 = (_Base_ptr)0x0;
        local_80 = (_Base_ptr)&pDStack_90;
        local_70 = (int *)0x0;
        local_78 = local_80;
        QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
        ::value(&lookaheads,&this->aut->lookaheads,(_List_iterator<Item> *)&local_b8,
                (set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                 *)local_98);
        std::
        _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
        ::~_Rb_tree((_Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                     *)local_98);
        if (((_List_node_base *)(local_b8.d + 1))->_M_next == (this->grammar->goal)._M_node) {
          this->accept_state = iVar22;
        }
        iVar7 = -iVar30;
        for (p_Var16 = lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var16 != &lookaheads._M_t._M_impl.super__Rb_tree_header;
            p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
          n = p_Var16 + 1;
          iVar9 = this->terminal_count;
          iVar8 = Automaton::id(this->aut,*(_List_node_base **)(p_Var16 + 1));
          iVar8 = iVar8 + iVar9 * iVar22;
          iVar9 = table[iVar8];
          if (iVar9 == 0) {
            table[iVar8] = iVar7;
          }
          else if (iVar9 < 0) {
            bVar21 = this->verbose;
            if ((bool)bVar21 == true) {
              pQVar15 = qout();
              pQVar15 = (QTextStream *)
                        QTextStream::operator<<
                                  (pQVar15,"*** Warning. Found a reduce/reduce conflict in state ");
              pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,iVar22);
              pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15," on token ``");
              pQVar15 = operator<<(pQVar15,(Name *)n);
              pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,"\'\' between rule ");
              pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,iVar30);
              pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15," and ");
              pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,-table[iVar8]);
              Qt::endl(pQVar15);
              iVar9 = table[iVar8];
              bVar21 = this->verbose;
            }
            local_15c = local_15c + 1;
            if (iVar9 <= iVar7) {
              iVar9 = iVar7;
            }
            table[iVar8] = iVar9;
            if ((bVar21 & 1) != 0) {
              pQVar15 = qout();
              pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,"\tresolved using rule ");
              iVar9 = -table[iVar8];
LAB_001060ec:
              pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,iVar9);
              Qt::endl(pQVar15);
            }
          }
          else if ((((_List_node_base *)(local_b8.d + 1))->_M_next[3]._M_next ==
                    (_List_node_base *)&this->grammar->names) ||
                  (bVar5 = QMap<std::_List_iterator<QString>,_Grammar::TokenInfo>::contains
                                     (&this->grammar->token_info,(_List_iterator<QString> *)n),
                  !bVar5)) {
            iVar26 = iVar26 + 1;
            if (this->verbose == true) {
              pQVar15 = qout();
              pQVar15 = (QTextStream *)
                        QTextStream::operator<<
                                  (pQVar15,"*** Warning. Found a shift/reduce conflict in state ");
              pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,iVar22);
              pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15," on token ``");
              pQVar15 = operator<<(pQVar15,(Name *)n);
              pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,"\'\' with rule ");
              iVar9 = iVar30;
              goto LAB_001060ec;
            }
          }
          else {
            local_98._0_4_ = NonAssoc;
            local_98._4_4_ = 0;
            TVar13 = QMap<std::_List_iterator<QString>,_Grammar::TokenInfo>::value
                               (&this->grammar->token_info,
                                (_List_iterator<QString> *)
                                (((_List_node_base *)(local_b8.d + 1))->_M_next + 3),
                                (TokenInfo *)local_98);
            local_98._0_4_ = NonAssoc;
            local_98._4_4_ = 0;
            TVar14 = QMap<std::_List_iterator<QString>,_Grammar::TokenInfo>::value
                               (&this->grammar->token_info,(_List_iterator<QString> *)n,
                                (TokenInfo *)local_98);
            if (TVar14.prec < TVar13.prec) {
LAB_00105fa2:
              table[iVar8] = iVar7;
            }
            else if (TVar13.prec == TVar14.prec) {
              if (TVar13.assoc == NonAssoc) {
                table[iVar8] = 0;
              }
              else if (TVar13.assoc == Left) goto LAB_00105fa2;
            }
          }
        }
        std::
        _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
        ::~_Rb_tree(&lookaheads._M_t);
      }
    }
    pAVar17 = this->aut;
  }
  if (iVar26 != 0 || local_15c != 0) {
    if ((iVar26 != this->grammar->expected_shift_reduce) ||
       (local_15c != this->grammar->expected_reduce_reduce)) {
      pQVar15 = qerr();
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,"*** Conflicts: ");
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,iVar26);
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15," shift/reduce, ");
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,local_15c);
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15," reduce/reduce");
      Qt::endl(pQVar15);
      if (this->warnings_are_errors == true) {
LAB_00107131:
        pQVar15 = qerr();
        pQVar15 = (QTextStream *)
                  QTextStream::operator<<
                            (pQVar15,
                             "qlalr: error: warning occurred, treating as error due to --exit-on-warn."
                            );
        Qt::endl(pQVar15);
        exit(2);
      }
    }
    if (this->verbose == true) {
      pQVar15 = qout();
      pQVar15 = (QTextStream *)Qt::endl(pQVar15);
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,"*** Conflicts: ");
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,iVar26);
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15," shift/reduce, ");
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,local_15c);
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15," reduce/reduce");
      pQVar15 = (QTextStream *)Qt::endl(pQVar15);
      Qt::endl(pQVar15);
    }
  }
  local_88 = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  local_98._0_4_ = 0xaaaaaaaa;
  local_98._4_4_ = -0x55555556;
  pDStack_90 = (Data *)0xaaaaaaaaaaaaaaaa;
  iVar26 = 0;
  QBitArray::QBitArray
            ((QBitArray *)local_98,
             (long)(int)(this->grammar->rules).super__List_base<Rule,_std::allocator<Rule>_>._M_impl
                        ._M_node._M_size,false);
  pAVar17 = this->aut;
  p_Var31 = (_List_node_base *)&pAVar17->states;
  while (p_Var31 = (((_List_base<State,_std::allocator<State>_> *)&p_Var31->_M_next)->_M_impl).
                   _M_node.super__List_node_base._M_next,
        p_Var31 != (_List_node_base *)&pAVar17->states) {
    for (iVar22 = 0; iVar22 < this->terminal_count; iVar22 = iVar22 + 1) {
      if (table[this->terminal_count * iVar26 + iVar22] < 0) {
        QBitArray::setBit((QBitArray *)local_98,
                          (ulong)(uint)~table[this->terminal_count * iVar26 + iVar22]);
      }
    }
    iVar26 = iVar26 + 1;
    pAVar17 = this->aut;
  }
  p_Var31 = (_List_node_base *)&this->grammar->rules;
  uVar33 = 0;
  do {
    pDVar23 = pDStack_90;
    if (pDStack_90 == (Data *)0x0) {
      pDVar23 = (Data *)&QByteArray::_empty;
    }
    if ((long)local_88 * 8 -
        (long)(char)(pDVar23->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i <=
        (long)uVar33) {
      pAVar17 = this->aut;
      p_Var31 = (_List_node_base *)&pAVar17->states;
      iVar26 = 0;
      while (p_Var31 = (((_List_base<State,_std::allocator<State>_> *)&p_Var31->_M_next)->_M_impl).
                       _M_node.super__List_node_base._M_next,
            p_Var31 != (_List_node_base *)&pAVar17->states) {
        for (iVar22 = 0; iVar22 < this->terminal_count; iVar22 = iVar22 + 1) {
          iVar30 = this->terminal_count * iVar26 + iVar22;
          if ((table[iVar30] < 0) &&
             (_Var18 = std::next<std::_List_iterator<Rule>>
                                 ((this->grammar->rules).
                                  super__List_base<Rule,_std::allocator<Rule>_>._M_impl._M_node.
                                  super__List_node_base._M_next,(ulong)(uint)~table[iVar30]),
             *(_List_node_base **)((long)(p_Var31 + 4 + 1) + 8) == _Var18._M_node)) {
            table[iVar30] = 0;
          }
        }
        iVar26 = iVar26 + 1;
        pAVar17 = this->aut;
      }
      this_00 = &this->defgoto;
      QList<int>::resize(this_00,(long)this->non_terminal_count);
      this_01 = &this->count;
      for (lVar32 = 0; uVar33 = (ulong)this->non_terminal_count, lVar32 < (long)uVar33;
          lVar32 = lVar32 + 1) {
        QList<int>::fill(this_01,0,(long)this->state_count);
        piVar19 = QList<int>::data(this_00);
        for (iVar26 = 0; iVar26 < this->state_count; iVar26 = iVar26 + 1) {
          iVar22 = table_00[this->non_terminal_count * iVar26 + (int)lVar32];
          lVar29 = (long)iVar22;
          if (lVar29 != 0) {
            piVar20 = QList<int>::data(this_01);
            piVar20[lVar29] = piVar20[lVar29] + 1;
            piVar20 = QList<int>::data(this_01);
            iVar30 = piVar20[lVar29];
            iVar7 = piVar19[lVar32];
            piVar20 = QList<int>::data(this_01);
            if (piVar20[iVar7] < iVar30) {
              piVar19[lVar32] = iVar22;
            }
          }
        }
      }
      for (iVar26 = 0; iVar26 < this->state_count; iVar26 = iVar26 + 1) {
        for (lVar32 = 0; lVar32 < (int)uVar33; lVar32 = lVar32 + 1) {
          iVar30 = (int)uVar33 * iVar26 + (int)lVar32;
          iVar22 = table_00[iVar30];
          piVar19 = QList<int>::data(this_00);
          if (iVar22 == piVar19[lVar32]) {
            table_00[iVar30] = 0;
          }
          uVar33 = (ulong)(uint)this->non_terminal_count;
        }
      }
      Compress::operator()(&this->compressed_action,table,this->state_count,this->terminal_count);
      Compress::operator()
                (&this->compressed_goto,table_00,this->state_count,this->non_terminal_count);
      operator_delete__(table);
      operator_delete__(table_00);
      if ((this->grammar->merged_output).d.size != 0) {
        local_d8._0_8_ = (Recognizer *)0xaaaaaaaaaaaaaaaa;
        local_d8._8_8_ = (Grammar *)0xaaaaaaaaaaaaaaaa;
        QFile::QFile((QFile *)local_d8,(QString *)this->grammar);
        cVar6 = QFile::open((QFile *)local_d8,2);
        pFVar4 = _stderr;
        if (cVar6 == '\0') {
          QString::toLocal8Bit((QByteArray *)&lookaheads,&this->grammar->merged_output);
          puVar25 = (undefined8 *)lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
          if (lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) {
            puVar25 = &QByteArray::_empty;
          }
          fprintf(pFVar4,"*** cannot create %s\n",puVar25);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&lookaheads);
        }
        else {
          local_f8.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_f8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          pCVar27 = (CppGenerator *)local_d8;
          QTextStream::QTextStream((QTextStream *)&local_f8,(QIODevice *)pCVar27);
          if (this->copyright == true) {
            copyrightHeader((QString *)&lookaheads,pCVar27);
            pCVar27 = (CppGenerator *)&lookaheads;
            pQVar15 = (QTextStream *)
                      QTextStream::operator<<((QTextStream *)&local_f8,(QString *)&lookaheads);
            privateCopyrightHeader((QString *)&local_b8,pCVar27);
            pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,(QString *)&local_b8);
            Qt::endl(pQVar15);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&lookaheads);
          }
          QTextStream::operator<<
                    ((QTextStream *)&local_f8,"// This file was generated by qlalr - DO NOT EDIT!\n"
                    );
          startIncludeGuard((QString *)&lookaheads,&this->grammar->merged_output);
          pQVar15 = (QTextStream *)
                    QTextStream::operator<<((QTextStream *)&local_f8,(QString *)&lookaheads);
          Qt::endl(pQVar15);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&lookaheads);
          if (this->copyright == true) {
            pQVar15 = (QTextStream *)
                      QTextStream::operator<<((QTextStream *)&local_f8,"#if defined(ERROR)");
            pQVar15 = (QTextStream *)Qt::endl(pQVar15);
            pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,"#  undef ERROR");
            pQVar15 = (QTextStream *)Qt::endl(pQVar15);
            pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,"#endif");
            pQVar15 = (QTextStream *)Qt::endl(pQVar15);
            Qt::endl(pQVar15);
          }
          generateDecl(this,(QTextStream *)&local_f8);
          generateImpl(this,(QTextStream *)&local_f8);
          pRVar3 = this->p;
          lookaheads._M_t._M_impl._0_8_ = (pRVar3->_M_decls).d.d;
          lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (pRVar3->_M_decls).d.ptr;
          lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)(pRVar3->_M_decls).d.size;
          if ((Data *)lookaheads._M_t._M_impl._0_8_ != (Data *)0x0) {
            LOCK();
            (((Data *)lookaheads._M_t._M_impl._0_8_)->super_QArrayData).ref_._q_value.
            super___atomic_base<int> =
                 (__atomic_base<int>)
                 ((__int_type)
                  (((Data *)lookaheads._M_t._M_impl._0_8_)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int> + 1);
            UNLOCK();
          }
          QTextStream::operator<<((QTextStream *)&local_f8,(QString *)&lookaheads);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&lookaheads);
          pRVar3 = this->p;
          lookaheads._M_t._M_impl._0_8_ = (pRVar3->_M_impls).d.d;
          lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (pRVar3->_M_impls).d.ptr;
          lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)(pRVar3->_M_impls).d.size;
          if ((Data *)lookaheads._M_t._M_impl._0_8_ != (Data *)0x0) {
            LOCK();
            (((Data *)lookaheads._M_t._M_impl._0_8_)->super_QArrayData).ref_._q_value.
            super___atomic_base<int> =
                 (__atomic_base<int>)
                 ((__int_type)
                  (((Data *)lookaheads._M_t._M_impl._0_8_)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int> + 1);
            UNLOCK();
          }
          QTextStream::operator<<((QTextStream *)&local_f8,(QString *)&lookaheads);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&lookaheads);
          Qt::endl((QTextStream *)&local_f8);
          endIncludeGuard((QString *)&lookaheads,&this->grammar->merged_output);
          pQVar15 = (QTextStream *)
                    QTextStream::operator<<((QTextStream *)&local_f8,(QString *)&lookaheads);
          Qt::endl(pQVar15);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&lookaheads);
          QTextStream::~QTextStream((QTextStream *)&local_f8);
        }
        QFile::~QFile((QFile *)local_d8);
        goto LAB_00106e31;
      }
      local_b8.size = -0x5555555555555556;
      local_b8.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_b8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      QString::toLower_helper((QString *)local_d8);
      lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_d8._16_8_
      ;
      lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = local_d8._8_8_;
      lookaheads._M_t._M_impl._0_8_ = local_d8._0_8_;
      local_d8._0_8_ = (Recognizer *)0x0;
      local_d8._8_8_ = (Grammar *)0x0;
      local_d8._16_8_ = (Automaton *)0x0;
      lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x4;
      lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)anon_var_dwarf_e869;
      QStringBuilder<QString,_QLatin1String>::convertTo<QString>
                ((QString *)&local_b8,(QStringBuilder<QString,_QLatin1String> *)&lookaheads);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&lookaheads);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_d8);
      local_d8._16_8_ = (Automaton *)0xaaaaaaaaaaaaaaaa;
      local_d8._0_8_ = (Recognizer *)0xaaaaaaaaaaaaaaaa;
      local_d8._8_8_ = (Grammar *)0xaaaaaaaaaaaaaaaa;
      QString::toLower_helper((QString *)&local_f8);
      lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_f8.size;
      lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = local_f8.ptr;
      lookaheads._M_t._M_impl._0_8_ = local_f8.d;
      local_f8.d = (Data *)0x0;
      local_f8.ptr = (char16_t *)0x0;
      local_f8.size = 0;
      lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x4;
      lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)anon_var_dwarf_e880;
      QStringBuilder<QString,_QLatin1String>::convertTo<QString>
                ((QString *)local_d8,(QStringBuilder<QString,_QLatin1String> *)&lookaheads);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&lookaheads);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
      local_108 = (Recognizer *)0xaaaaaaaaaaaaaaaa;
      pGStack_100 = (Grammar *)0xaaaaaaaaaaaaaaaa;
      QFile::QFile((QFile *)&local_108,(QString *)&local_b8);
      cVar6 = QFile::open((QFile *)&local_108,2);
      pFVar4 = _stderr;
      if (cVar6 == '\0') {
        QString::toLocal8Bit((QByteArray *)&lookaheads,(QString *)&local_b8);
        puVar25 = (undefined8 *)lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
        if (lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) {
          puVar25 = &QByteArray::_empty;
        }
        QIODevice::errorString();
        QString::toLocal8Bit((QByteArray *)&local_f8,(QString *)&local_120);
        pGVar24 = (Grammar *)local_f8.ptr;
        if ((Grammar *)local_f8.ptr == (Grammar *)0x0) {
          pGVar24 = (Grammar *)&QByteArray::_empty;
        }
        fprintf(pFVar4,"*** cannot create %s: %s\n",puVar25,pGVar24);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_f8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&lookaheads);
      }
      else {
        local_138 = 0xaaaaaaaaaaaaaaaa;
        uStack_130 = 0xaaaaaaaaaaaaaaaa;
        QTextStream::QTextStream((QTextStream *)&local_138,(QIODevice *)&local_108);
        lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0xaaaaaaaaaaaaaaaa;
        lookaheads._M_t._M_impl._0_8_ = 0xaaaaaaaaaaaaaaaa;
        lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xaaaaaaaa;
        lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0xaaaaaaaa;
        QString::toUpper_helper((QString *)&local_f8);
        pCVar27 = (CppGenerator *)0x2e;
        puVar25 = (undefined8 *)QString::replace((QChar)(char16_t)&local_f8,(QChar)0x2e,0x5f);
        lookaheads._M_t._M_impl._0_8_ = *puVar25;
        lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = puVar25[1];
        lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)puVar25[2];
        if ((int *)lookaheads._M_t._M_impl._0_8_ != (int *)0x0) {
          LOCK();
          *(int *)lookaheads._M_t._M_impl._0_8_ = *(int *)lookaheads._M_t._M_impl._0_8_ + 1;
          UNLOCK();
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
        if (this->copyright == true) {
          copyrightHeader((QString *)&local_f8,pCVar27);
          pCVar27 = (CppGenerator *)&local_f8;
          pQVar15 = (QTextStream *)
                    QTextStream::operator<<((QTextStream *)&local_138,(QString *)&local_f8);
          privateCopyrightHeader((QString *)&local_120,pCVar27);
          pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,(QString *)&local_120);
          Qt::endl(pQVar15);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
        }
        QTextStream::operator<<
                  ((QTextStream *)&local_138,"// This file was generated by qlalr - DO NOT EDIT!\n")
        ;
        pQVar15 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_138,"#ifndef ");
        pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,(QString *)&lookaheads);
        pQVar15 = (QTextStream *)Qt::endl(pQVar15);
        pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,"#define ");
        pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,(QString *)&lookaheads);
        pQVar15 = (QTextStream *)Qt::endl(pQVar15);
        Qt::endl(pQVar15);
        if (this->copyright == true) {
          pQVar15 = (QTextStream *)
                    QTextStream::operator<<((QTextStream *)&local_138,"#include <QtCore/qglobal.h>")
          ;
          pQVar15 = (QTextStream *)Qt::endl(pQVar15);
          Qt::endl(pQVar15);
          pQVar15 = (QTextStream *)
                    QTextStream::operator<<((QTextStream *)&local_138,"QT_BEGIN_NAMESPACE");
          pQVar15 = (QTextStream *)Qt::endl(pQVar15);
          Qt::endl(pQVar15);
        }
        generateDecl(this,(QTextStream *)&local_138);
        if (this->copyright == true) {
          pQVar15 = (QTextStream *)
                    QTextStream::operator<<((QTextStream *)&local_138,"QT_END_NAMESPACE");
          Qt::endl(pQVar15);
        }
        pQVar15 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_138,"#endif // ");
        pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,(QString *)&lookaheads);
        pQVar15 = (QTextStream *)Qt::endl(pQVar15);
        Qt::endl(pQVar15);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&lookaheads);
        QTextStream::~QTextStream((QTextStream *)&local_138);
      }
      QFile::~QFile((QFile *)&local_108);
      if (cVar6 != '\0') {
        local_108 = (Recognizer *)0xaaaaaaaaaaaaaaaa;
        pGStack_100 = (Grammar *)0xaaaaaaaaaaaaaaaa;
        QFile::QFile((QFile *)&local_108,(QString *)local_d8);
        cVar6 = QFile::open((QFile *)&local_108,2);
        pFVar4 = _stderr;
        if (cVar6 == '\0') {
          QString::toLocal8Bit((QByteArray *)&lookaheads,(QString *)local_d8);
          puVar25 = (undefined8 *)lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
          if (lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) {
            puVar25 = &QByteArray::_empty;
          }
          QIODevice::errorString();
          QString::toLocal8Bit((QByteArray *)&local_f8,(QString *)&local_120);
          pGVar24 = (Grammar *)local_f8.ptr;
          if ((Grammar *)local_f8.ptr == (Grammar *)0x0) {
            pGVar24 = (Grammar *)&QByteArray::_empty;
          }
          fprintf(pFVar4,"*** cannot create %s: %s\n",puVar25,pGVar24);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_f8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&lookaheads);
        }
        else {
          local_f8.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_f8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          pCVar27 = (CppGenerator *)&local_108;
          QTextStream::QTextStream((QTextStream *)&local_f8,(QIODevice *)pCVar27);
          if (this->copyright == true) {
            copyrightHeader((QString *)&lookaheads,pCVar27);
            QTextStream::operator<<((QTextStream *)&local_f8,(QString *)&lookaheads);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&lookaheads);
          }
          QTextStream::operator<<
                    ((QTextStream *)&local_f8,"// This file was generated by qlalr - DO NOT EDIT!\n"
                    );
          pQVar15 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_f8,"#include \"");
          pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,(QString *)&local_b8);
          pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,"\"");
          pQVar15 = (QTextStream *)Qt::endl(pQVar15);
          Qt::endl(pQVar15);
          if (this->copyright == true) {
            pQVar15 = (QTextStream *)
                      QTextStream::operator<<((QTextStream *)&local_f8,"QT_BEGIN_NAMESPACE");
            pQVar15 = (QTextStream *)Qt::endl(pQVar15);
            Qt::endl(pQVar15);
          }
          generateImpl(this,(QTextStream *)&local_f8);
          if (this->copyright == true) {
            pQVar15 = (QTextStream *)
                      QTextStream::operator<<((QTextStream *)&local_f8,"QT_END_NAMESPACE");
            Qt::endl(pQVar15);
          }
          QTextStream::~QTextStream((QTextStream *)&local_f8);
        }
        QFile::~QFile((QFile *)&local_108);
        if (cVar6 != '\0') {
          pGVar24 = this->grammar;
          if ((pGVar24->decl_file_name).d.size != 0) {
            local_108 = (Recognizer *)0xaaaaaaaaaaaaaaaa;
            pGStack_100 = (Grammar *)0xaaaaaaaaaaaaaaaa;
            QFile::QFile((QFile *)&local_108,(QString *)&pGVar24->decl_file_name);
            cVar6 = QFile::open((QFile *)&local_108,2);
            pFVar4 = _stderr;
            if (cVar6 == '\0') {
              QString::toLocal8Bit((QByteArray *)&lookaheads,&this->grammar->decl_file_name);
              puVar25 = (undefined8 *)lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
              if (lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) {
                puVar25 = &QByteArray::_empty;
              }
              QIODevice::errorString();
              QString::toLocal8Bit((QByteArray *)&local_f8,(QString *)&local_120);
              pGVar24 = (Grammar *)local_f8.ptr;
              if ((Grammar *)local_f8.ptr == (Grammar *)0x0) {
                pGVar24 = (Grammar *)&QByteArray::_empty;
              }
              fprintf(pFVar4,"*** cannot create %s: %s\n",puVar25,pGVar24);
              QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_f8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
              QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&lookaheads);
            }
            else {
              local_f8.d = (Data *)0xaaaaaaaaaaaaaaaa;
              local_f8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
              QTextStream::QTextStream((QTextStream *)&local_f8,(QIODevice *)&local_108);
              pRVar3 = this->p;
              lookaheads._M_t._M_impl._0_8_ = (pRVar3->_M_decls).d.d;
              lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   (pRVar3->_M_decls).d.ptr;
              lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)(pRVar3->_M_decls).d.size;
              if ((Data *)lookaheads._M_t._M_impl._0_8_ != (Data *)0x0) {
                LOCK();
                (((Data *)lookaheads._M_t._M_impl._0_8_)->super_QArrayData).ref_._q_value.
                super___atomic_base<int> =
                     (__atomic_base<int>)
                     ((__int_type)
                      (((Data *)lookaheads._M_t._M_impl._0_8_)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int> + 1);
                UNLOCK();
              }
              QTextStream::operator<<((QTextStream *)&local_f8,(QString *)&lookaheads);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&lookaheads);
              QTextStream::~QTextStream((QTextStream *)&local_f8);
            }
            QFile::~QFile((QFile *)&local_108);
            if (cVar6 == '\0') goto LAB_00106e17;
            pGVar24 = this->grammar;
          }
          if ((pGVar24->impl_file_name).d.size != 0) {
            local_108 = (Recognizer *)0xaaaaaaaaaaaaaaaa;
            pGStack_100 = (Grammar *)0xaaaaaaaaaaaaaaaa;
            QFile::QFile((QFile *)&local_108,(QString *)&pGVar24->impl_file_name);
            cVar6 = QFile::open((QFile *)&local_108,2);
            pFVar4 = _stderr;
            if (cVar6 == '\0') {
              QString::toLocal8Bit((QByteArray *)&lookaheads,&this->grammar->impl_file_name);
              puVar25 = (undefined8 *)lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
              if (lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) {
                puVar25 = &QByteArray::_empty;
              }
              QIODevice::errorString();
              QString::toLocal8Bit((QByteArray *)&local_f8,(QString *)&local_120);
              pGVar24 = (Grammar *)local_f8.ptr;
              if ((Grammar *)local_f8.ptr == (Grammar *)0x0) {
                pGVar24 = (Grammar *)&QByteArray::_empty;
              }
              fprintf(pFVar4,"*** cannot create %s: %s\n",puVar25,pGVar24);
              QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_f8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
              QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&lookaheads);
            }
            else {
              local_f8.d = (Data *)0xaaaaaaaaaaaaaaaa;
              local_f8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
              QTextStream::QTextStream((QTextStream *)&local_f8,(QIODevice *)&local_108);
              pRVar3 = this->p;
              lookaheads._M_t._M_impl._0_8_ = (pRVar3->_M_impls).d.d;
              lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   (pRVar3->_M_impls).d.ptr;
              lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)(pRVar3->_M_impls).d.size;
              if ((Data *)lookaheads._M_t._M_impl._0_8_ != (Data *)0x0) {
                LOCK();
                (((Data *)lookaheads._M_t._M_impl._0_8_)->super_QArrayData).ref_._q_value.
                super___atomic_base<int> =
                     (__atomic_base<int>)
                     ((__int_type)
                      (((Data *)lookaheads._M_t._M_impl._0_8_)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int> + 1);
                UNLOCK();
              }
              QTextStream::operator<<((QTextStream *)&local_f8,(QString *)&lookaheads);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&lookaheads);
              QTextStream::~QTextStream((QTextStream *)&local_f8);
            }
            QFile::~QFile((QFile *)&local_108);
          }
        }
      }
LAB_00106e17:
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_d8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
LAB_00106e31:
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_98);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
        __stack_chk_fail();
      }
      return;
    }
    p_Var31 = (((_List_base<Rule,_std::allocator<Rule>_> *)&p_Var31->_M_next)->_M_impl)._M_node.
              super__List_node_base._M_next;
    if (((*(byte *)((long)&(pDStack_90->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                           _M_i + (uVar33 >> 3) + 1) >> ((uint)uVar33 & 7) & 1) == 0) &&
       (p_Var31 != (this->grammar->goal)._M_node)) {
      pQVar15 = qerr();
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,"*** Warning: Rule ``");
      pQVar15 = operator<<(pQVar15,(Rule *)(p_Var31 + 1));
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,"\'\' is useless!");
      Qt::endl(pQVar15);
      if (this->warnings_are_errors == true) goto LAB_00107131;
    }
    uVar33 = uVar33 + 1;
  } while( true );
}

Assistant:

void CppGenerator::operator () ()
{
  // action table...
  state_count = static_cast<int>(aut.states.size());
  terminal_count = static_cast<int>(grammar.terminals.size());
  non_terminal_count = static_cast<int>(grammar.non_terminals.size());

#define ACTION(i, j) table [(i) * terminal_count + (j)]
#define GOTO(i, j) pgoto [(i) * non_terminal_count + (j)]

  int *table = new int [state_count * terminal_count];
  ::memset (table, 0, state_count * terminal_count * sizeof (int));

  int *pgoto = new int [state_count * non_terminal_count];
  ::memset (pgoto, 0, state_count * non_terminal_count * sizeof (int));

  accept_state = -1;
  int shift_reduce_conflict_count = 0;
  int reduce_reduce_conflict_count = 0;

  for (StatePointer state = aut.states.begin (); state != aut.states.end (); ++state)
    {
      int q = aut.id (state);

      for (Bundle::iterator a = state->bundle.begin (); a != state->bundle.end (); ++a)
        {
          int symbol = aut.id (a.key ());
          int r = aut.id (a.value ());

          Q_ASSERT (r < state_count);

          if (grammar.isNonTerminal (a.key ()))
            {
              Q_ASSERT(symbol >= terminal_count && symbol < static_cast<int>(grammar.names.size()));
              GOTO (q, symbol - terminal_count) = r;
            }

          else
            ACTION (q, symbol) = r;
        }

      for (ItemPointer item = state->closure.begin (); item != state->closure.end (); ++item)
        {
          if (item->dot != item->end_rhs ())
            continue;

          int r = aut.id (item->rule);

          const NameSet lookaheads = aut.lookaheads.value (item);

          if (item->rule == grammar.goal)
            accept_state = q;

          for (const Name &s : lookaheads)
            {
              int &u = ACTION (q, aut.id (s));

              if (u == 0)
                u = - r;

              else if (u < 0)
                {
                  if (verbose)
                    qout() << "*** Warning. Found a reduce/reduce conflict in state " << q << " on token ``" << s << "'' between rule "
                         << r << " and " << -u << Qt::endl;

                  ++reduce_reduce_conflict_count;

                  u = qMax (u, -r);

                  if (verbose)
                    qout() << "\tresolved using rule " << -u << Qt::endl;
                }

              else if (u > 0)
                {
                  if (item->rule->prec != grammar.names.end() && grammar.token_info.contains (s))
                    {
                      Grammar::TokenInfo info_r = grammar.token_info.value (item->rule->prec);
                      Grammar::TokenInfo info_s = grammar.token_info.value (s);

                      if (info_r.prec > info_s.prec)
                        u = -r;
                      else if (info_r.prec == info_s.prec)
                        {
                          switch (info_r.assoc) {
                          case Grammar::Left:
                            u = -r;
                            break;
                          case Grammar::Right:
                            // shift... nothing to do
                            break;
                          case Grammar::NonAssoc:
                            u = 0;
                            break;
                          } // switch
                        }
                    }

                  else
                    {
                      ++shift_reduce_conflict_count;

                      if (verbose)
                        qout() << "*** Warning. Found a shift/reduce conflict in state " << q << " on token ``" << s << "'' with rule " << r << Qt::endl;
                    }
                }
            }
        }
    }

  if (shift_reduce_conflict_count || reduce_reduce_conflict_count)
    {
      if (shift_reduce_conflict_count != grammar.expected_shift_reduce
          || reduce_reduce_conflict_count != grammar.expected_reduce_reduce)
        {
          qerr() << "*** Conflicts: " << shift_reduce_conflict_count << " shift/reduce, " << reduce_reduce_conflict_count << " reduce/reduce" << Qt::endl;
          if (warnings_are_errors)
            {
              qerr() << "qlalr: error: warning occurred, treating as error due to "
                        "--exit-on-warn." << Qt::endl;
              exit(2);
            }
        }

      if (verbose)
        qout() << Qt::endl << "*** Conflicts: " << shift_reduce_conflict_count << " shift/reduce, " << reduce_reduce_conflict_count << " reduce/reduce" << Qt::endl
             << Qt::endl;
    }

  QBitArray used_rules{static_cast<int>(grammar.rules.size())};

  int q = 0;
  for (StatePointer state = aut.states.begin (); state != aut.states.end (); ++state, ++q)
    {
      for (int j = 0; j < terminal_count; ++j)
        {
          int &u = ACTION (q, j);

          if (u < 0)
            used_rules.setBit (-u - 1);
        }
    }

  auto rule = grammar.rules.begin();
  for (int i = 0; i < used_rules.size(); ++i, ++rule)
    {
      if (! used_rules.testBit (i))
        {
          if (rule != grammar.goal)
            {
              qerr() << "*** Warning: Rule ``" << *rule << "'' is useless!" << Qt::endl;
              if (warnings_are_errors)
                {
                  qerr() << "qlalr: error: warning occurred, treating as error due to "
                            "--exit-on-warn." << Qt::endl;
                  exit(2);
                }
            }
        }
    }

  q = 0;
  for (StatePointer state = aut.states.begin (); state != aut.states.end (); ++state, ++q)
    {
      for (int j = 0; j < terminal_count; ++j)
        {
          int &u = ACTION (q, j);

          if (u >= 0)
            continue;

          RulePointer rule = std::next(grammar.rules.begin(), - u - 1);

          if (state->defaultReduce == rule)
            u = 0;
        }
    }

  // ... compress the goto table
  defgoto.resize (non_terminal_count);
  for (int j = 0; j < non_terminal_count; ++j)
    {
      count.fill (0, state_count);

      int &mx = defgoto [j];

      for (int i = 0; i < state_count; ++i)
        {
          int r = GOTO (i, j);

          if (! r)
            continue;

          ++count [r];

          if (count [r] > count [mx])
            mx = r;
        }
    }

  for (int i = 0; i < state_count; ++i)
    {
      for (int j = 0; j < non_terminal_count; ++j)
        {
          int &r = GOTO (i, j);

          if (r == defgoto [j])
            r = 0;
        }
    }

  compressed_action (table, state_count, terminal_count);
  compressed_goto (pgoto, state_count, non_terminal_count);

  delete[] table;
  table = nullptr;

  delete[] pgoto;
  pgoto = nullptr;

#undef ACTION
#undef GOTO

  if (! grammar.merged_output.isEmpty())
    {
      QFile f(grammar.merged_output);
      if (! f.open (QFile::WriteOnly))
        {
          fprintf (stderr, "*** cannot create %s\n", qPrintable(grammar.merged_output));
          return;
        }

      QTextStream out (&f);

      // copyright headers must come first, otherwise the headers tests will fail
      if (copyright)
        {
          out << copyrightHeader()
              << privateCopyrightHeader()
              << Qt::endl;
        }

      out << "// This file was generated by qlalr - DO NOT EDIT!\n";

      out << startIncludeGuard(grammar.merged_output) << Qt::endl;

      if (copyright) {
          out << "#if defined(ERROR)" << Qt::endl
              << "#  undef ERROR" << Qt::endl
              << "#endif" << Qt::endl << Qt::endl;
      }

      generateDecl (out);
      generateImpl (out);
      out << p.decls();
      out << p.impls();
      out << Qt::endl;

      out << endIncludeGuard(grammar.merged_output) << Qt::endl;

      return;
    }

  // default behaviour
  QString declFileName = grammar.table_name.toLower () + "_p.h"_L1;
  QString bitsFileName = grammar.table_name.toLower () + ".cpp"_L1;

  { // decls...
    QFile f (declFileName);
    if (! f.open (QFile::WriteOnly))
      {
        fprintf (stderr, "*** cannot create %s: %s\n",
                 qPrintable(declFileName), qPrintable(f.errorString()));
        return;
      }
    QTextStream out (&f);

    QString prot = declFileName.toUpper ().replace (QLatin1Char ('.'), QLatin1Char ('_'));

    // copyright headers must come first, otherwise the headers tests will fail
    if (copyright)
      {
        out << copyrightHeader()
            << privateCopyrightHeader()
            << Qt::endl;
      }

    out << "// This file was generated by qlalr - DO NOT EDIT!\n";

    out << "#ifndef " << prot << Qt::endl
        << "#define " << prot << Qt::endl
        << Qt::endl;

    if (copyright) {
        out << "#include <QtCore/qglobal.h>" << Qt::endl << Qt::endl;
        out << "QT_BEGIN_NAMESPACE" << Qt::endl << Qt::endl;
    }
    generateDecl (out);
    if (copyright)
        out << "QT_END_NAMESPACE" << Qt::endl;

    out << "#endif // " << prot << Qt::endl << Qt::endl;
  } // end decls

  { // bits...
    QFile f (bitsFileName);
    if (! f.open (QFile::WriteOnly))
      {
        fprintf (stderr, "*** cannot create %s: %s\n",
                 qPrintable(bitsFileName), qPrintable(f.errorString()));
        return;
      }
    QTextStream out (&f);

    // copyright headers must come first, otherwise the headers tests will fail
    if (copyright)
      out << copyrightHeader();

    out << "// This file was generated by qlalr - DO NOT EDIT!\n";

    out << "#include \"" << declFileName << "\"" << Qt::endl << Qt::endl;
    if (copyright)
        out << "QT_BEGIN_NAMESPACE" << Qt::endl << Qt::endl;
    generateImpl(out);
    if (copyright)
        out << "QT_END_NAMESPACE" << Qt::endl;

  } // end bits

  if (! grammar.decl_file_name.isEmpty ())
    {
      QFile f (grammar.decl_file_name);
      if (! f.open (QFile::WriteOnly))
        {
          fprintf (stderr, "*** cannot create %s: %s\n",
                   qPrintable(grammar.decl_file_name), qPrintable(f.errorString()));
          return;
        }
      QTextStream out (&f);
      out << p.decls();
    }

  if (! grammar.impl_file_name.isEmpty ())
    {
      QFile f (grammar.impl_file_name);
      if (! f.open (QFile::WriteOnly))
        {
          fprintf (stderr, "*** cannot create %s: %s\n",
                   qPrintable(grammar.impl_file_name), qPrintable(f.errorString()));
          return;
        }
      QTextStream out (&f);
      out << p.impls();
    }
}